

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_parser.cpp
# Opt level: O3

Node * __thiscall Parser::parseTableCreation(Parser *this)

{
  pointer *ppEVar1;
  Token *t;
  iterator __position;
  Token *t_00;
  pointer pTVar2;
  int iVar3;
  ulong uVar4;
  Node *pNVar5;
  vector<Token,_std::allocator<Token>_> *pvVar6;
  ulong uVar7;
  TokenType TVar8;
  Node *key;
  Node *value;
  vector<Node_*,_std::allocator<Node_*>_> keys;
  vector<Token_*,_std::allocator<Token_*>_> assignmentTokens;
  vector<Node_*,_std::allocator<Node_*>_> values;
  Node *local_98;
  Node *local_90;
  vector<Node_*,_std::allocator<Node_*>_> local_88;
  vector<Token_*,_std::allocator<Token_*>_> local_68;
  vector<Node_*,_std::allocator<Node_*>_> local_48;
  
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)((ulong)local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                              super__Vector_impl_data._M_start & 0xffffffff00000000);
  __position._M_current =
       (this->expressionContext).
       super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->expressionContext).
      super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>::
    _M_realloc_insert<Parser::ExpressionContext>
              (&this->expressionContext,__position,(ExpressionContext *)&local_88);
  }
  else {
    *__position._M_current = EC_USUAL;
    (this->expressionContext).
    super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>.
    _M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  t_00 = this->tok;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Node **)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Node **)0x0;
  local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Node **)0x0;
  local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (Token **)0x0;
  local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Token **)0x0;
  pvVar6 = this->tokens;
  uVar4 = (ulong)this->pos;
  pTVar2 = (pvVar6->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pTVar2[uVar4].type == TK_RBRACE) {
    this->tok = pTVar2 + uVar4;
    this->pos = this->pos + 1;
    pNVar5 = createTableCreationNode(this,t_00,&local_88,&local_48,&local_68);
  }
  else {
    do {
      local_98 = (Node *)0x0;
      local_90 = (Node *)0x0;
      iVar3 = (int)uVar4;
      t = (pvVar6->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start + iVar3;
      TVar8 = t->type;
      if ((int)TVar8 < 0x19) {
        if (TVar8 == TK_IDENTIFIER) {
          this->tok = t;
          this->pos = iVar3 + 1;
          local_98 = createIdentifierNode(this,t);
          iVar3 = this->pos;
          pTVar2 = (this->tokens->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if (pTVar2[iVar3].type == TK_ASSIGN) {
            this->tok = pTVar2 + iVar3;
            this->pos = iVar3 + 1;
          }
          else {
            local_90 = createIdentifierNode(this,this->tok);
          }
        }
        else if (TVar8 == TK_STRING_LITERAL) {
          this->tok = t;
          this->pos = iVar3 + 1;
          local_98 = createOperandNode(this,t);
          TVar8 = TK_COLON;
          goto LAB_00112edd;
        }
      }
      else if (TVar8 == TK_LSQUARE) {
        this->tok = t;
        this->pos = iVar3 + 1;
        pNVar5 = parseTernaryOp(this);
        local_98 = createMakeKeyNode(this,t,pNVar5);
        TVar8 = TK_ASSIGN;
        expect(this,TK_RSQUARE);
LAB_00112edd:
        expect(this,TVar8);
      }
      else if (TVar8 == TK_FUNCTION) {
        this->tok = t;
        this->pos = iVar3 + 1;
        local_90 = parseFunction(this,FT_FUNCTION);
        if (local_90 != (Node *)0x0) {
          local_98 = *(local_90->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>.
                      _M_impl.super__Vector_impl_data._M_start;
        }
      }
      if ((local_98 == (Node *)0x0) || (this->ctx->isError != false)) {
LAB_00113018:
        pNVar5 = (Node *)0x0;
        goto LAB_0011301b;
      }
      if (local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Token*,std::allocator<Token*>>::_M_realloc_insert<Token*const&>
                  ((vector<Token*,std::allocator<Token*>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&this->tok);
      }
      else {
        *local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
         super__Vector_impl_data._M_finish = this->tok;
        local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if ((local_90 == (Node *)0x0) && (local_90 = parseTernaryOp(this), local_90 == (Node *)0x0))
      goto LAB_00113018;
      if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)&local_88,
                   (iterator)
                   local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_98);
      }
      else {
        *local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_98;
        local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                  ((vector<Node*,std::allocator<Node*>> *)&local_48,
                   (iterator)
                   local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_90);
      }
      else {
        *local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish = local_90;
        local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      pvVar6 = this->tokens;
      uVar4 = (ulong)(uint)this->pos;
      uVar7 = (ulong)this->pos;
      pTVar2 = (pvVar6->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
               super__Vector_impl_data._M_start;
      TVar8 = pTVar2[uVar7].type;
      if (TVar8 == TK_COMMA) {
        this->tok = pTVar2 + uVar7;
        uVar7 = uVar7 + 1;
        this->pos = (int)uVar7;
        TVar8 = pTVar2[uVar7].type;
        uVar4 = uVar7 & 0xffffffff;
      }
    } while (TVar8 != TK_RBRACE);
    this->tok = pTVar2 + uVar7;
    this->pos = (int)uVar4 + 1;
    pNVar5 = createTableCreationNode(this,t_00,&local_88,&local_48,&local_68);
  }
LAB_0011301b:
  if (local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<Token_*,_std::allocator<Token_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ppEVar1 = &(this->expressionContext).
             super__Vector_base<Parser::ExpressionContext,_std::allocator<Parser::ExpressionContext>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  *ppEVar1 = *ppEVar1 + -1;
  return pNVar5;
}

Assistant:

Node * parseTableCreation()
  {
    EXPRESSION_CONTEXT_SCOPE(EC_USUAL);

    Token & opToken = *tok;
    std::vector<Node *> keys;
    std::vector<Node *> values;
    std::vector<Token *> assignmentTokens;

    if (accept(TK_RBRACE))
      return createTableCreationNode(opToken, keys, values, assignmentTokens);

    for (;;)
    {
      Node * key = nullptr;
      Node * value = nullptr;

      if (accept(TK_IDENTIFIER))
      {
        key = createIdentifierNode(*tok);
        if (!accept(TK_ASSIGN))
          value = createIdentifierNode(*tok);
      }
      else if (accept(TK_LSQUARE))
      {
        key = createMakeKeyNode(*tok, parseTernaryOp());
        expect(TK_RSQUARE);
        expect(TK_ASSIGN);
      }
      else if (accept(TK_STRING_LITERAL))
      {
        key = createOperandNode(*tok);
        expect(TK_COLON);
      }
      else if (accept(TK_FUNCTION))
      {
        value = parseFunction(FT_FUNCTION);
        if (value)
          key = value->children[0]; // function name
      }

      if (!key || ctx.isError)
        break;

      assignmentTokens.push_back(tok);

      if (!value)
        value = parseTernaryOp();
      if (!value)
        break;

      keys.push_back(key);
      values.push_back(value);
      accept(TK_COMMA); // optional comma
      if (accept(TK_RBRACE))
        return createTableCreationNode(opToken, keys, values, assignmentTokens);
    }

    return nullptr;
  }